

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CriticalSectionsBuilder.cpp
# Opt level: O2

set<const_llvm::Instruction_*,_std::less<const_llvm::Instruction_*>,_std::allocator<const_llvm::Instruction_*>_>
* __thiscall
CriticalSection::nodes
          (set<const_llvm::Instruction_*,_std::less<const_llvm::Instruction_*>,_std::allocator<const_llvm::Instruction_*>_>
           *__return_storage_ptr__,CriticalSection *this)

{
  _Rb_tree_header *p_Var1;
  Node *this_00;
  bool bVar2;
  _Base_ptr p_Var3;
  Instruction *local_30;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  for (p_Var3 = (this->nodes_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &(this->nodes_)._M_t._M_impl.super__Rb_tree_header;
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
    this_00 = *(Node **)(p_Var3 + 1);
    bVar2 = Node::isArtificial(this_00);
    if (!bVar2) {
      local_30 = Node::llvmInstruction(this_00);
      std::
      _Rb_tree<llvm::Instruction_const*,llvm::Instruction_const*,std::_Identity<llvm::Instruction_const*>,std::less<llvm::Instruction_const*>,std::allocator<llvm::Instruction_const*>>
      ::_M_insert_unique<llvm::Instruction_const*>
                ((_Rb_tree<llvm::Instruction_const*,llvm::Instruction_const*,std::_Identity<llvm::Instruction_const*>,std::less<llvm::Instruction_const*>,std::allocator<llvm::Instruction_const*>>
                  *)__return_storage_ptr__,&local_30);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::set<const llvm::Instruction *> CriticalSection::nodes() const {
    std::set<const llvm::Instruction *> llvmNodes;
    for (auto *node : nodes_) {
        if (!node->isArtificial()) {
            llvmNodes.insert(node->llvmInstruction());
        }
    }
    return llvmNodes;
}